

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiIO::AddMousePosEvent(ImGuiIO *this,float x,float y)

{
  int *piVar1;
  int iVar2;
  ImGuiInputEvent *pIVar3;
  ImGuiContext *pIVar4;
  ImGuiInputEvent *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  if (&GImGui->IO == this) {
    iVar6 = (GImGui->InputEventsQueue).Size;
    iVar2 = (GImGui->InputEventsQueue).Capacity;
    if (iVar6 == iVar2) {
      iVar6 = iVar6 + 1;
      if (iVar2 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar2 / 2 + iVar2;
      }
      if (iVar6 < iVar5) {
        iVar6 = iVar5;
      }
      if (iVar2 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiInputEvent *)
                 (*GImAllocatorAllocFunc)((long)iVar6 * 0x18,GImAllocatorUserData);
        pIVar3 = (pIVar4->InputEventsQueue).Data;
        if (pIVar3 != (ImGuiInputEvent *)0x0) {
          memcpy(__dest,pIVar3,(long)(pIVar4->InputEventsQueue).Size * 0x18);
          pIVar3 = (pIVar4->InputEventsQueue).Data;
          if ((pIVar3 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
        }
        (pIVar4->InputEventsQueue).Data = __dest;
        (pIVar4->InputEventsQueue).Capacity = iVar6;
      }
    }
    pIVar3 = (pIVar4->InputEventsQueue).Data;
    iVar6 = (pIVar4->InputEventsQueue).Size;
    pIVar3[iVar6].Type = ImGuiInputEventType_MousePos;
    pIVar3[iVar6].Source = ImGuiInputSource_Mouse;
    pIVar3[iVar6].field_2.MousePos.PosX = x;
    pIVar3[iVar6].field_2.MousePos.PosY = y;
    *(undefined8 *)((long)&pIVar3[iVar6].field_2 + 8) = 0;
    (pIVar4->InputEventsQueue).Size = (pIVar4->InputEventsQueue).Size + 1;
    return;
  }
  __assert_fail("&g.IO == this && \"Can only add events to current context.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x55e,"void ImGuiIO::AddMousePosEvent(float, float)");
}

Assistant:

void ImGuiIO::AddMousePosEvent(float x, float y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MousePos;
    e.Source = ImGuiInputSource_Mouse;
    e.MousePos.PosX = x;
    e.MousePos.PosY = y;
    g.InputEventsQueue.push_back(e);
}